

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_mtvsrwz(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 xsh;
  TCGv_i64 tmp;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = xS(ctx->opcode);
  if (uVar1 < 0x20) {
    if (((ctx->fpu_enabled ^ 0xffU) & 1) != 0) {
      gen_exception(ctx,7);
      return;
    }
  }
  else if (((ctx->altivec_enabled ^ 0xffU) & 1) != 0) {
    gen_exception(ctx,0x49);
    return;
  }
  ret = tcg_temp_new_i64(tcg_ctx_00);
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  uVar1 = rA(ctx->opcode);
  tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1]);
  tcg_gen_ext32u_i64_ppc64(tcg_ctx_00,ret_00,ret);
  uVar1 = xT(ctx->opcode);
  set_cpu_vsrh(tcg_ctx_00,uVar1,ret_00);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  tcg_temp_free_i64(tcg_ctx_00,ret_00);
  return;
}

Assistant:

static void gen_mtvsrwz(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (xS(ctx->opcode) < 32) {
        if (unlikely(!ctx->fpu_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_FPU);
            return;
        }
    } else {
        if (unlikely(!ctx->altivec_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VPU);
            return;
        }
    }
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 xsh = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, tmp, cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_ext32u_i64(tcg_ctx, xsh, tmp);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xsh);
    tcg_temp_free_i64(tcg_ctx, tmp);
    tcg_temp_free_i64(tcg_ctx, xsh);
}